

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O2

void __thiscall ThreadPool::RunInThread(ThreadPool *this)

{
  CallFunc task;
  CallFunc local_30;
  
  while (this->m_bRunning == true) {
    Take(&local_30,this);
    if (local_30.super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_()>::operator()(&local_30);
    }
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
  }
  return;
}

Assistant:

void ThreadPool::RunInThread()
{
	while(m_bRunning)
	{
		CallFunc task = Take();
		if (task)
		{
			task();
		}
	}
}